

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_info.c
# Opt level: O0

void do_exits(CHAR_DATA *ch,char *argument)

{
  long *plVar1;
  ulong uVar2;
  CHAR_DATA **ppCVar3;
  bool bVar4;
  byte bVar5;
  bool bVar6;
  size_t sVar7;
  char *pcVar8;
  char *pcVar9;
  char *in_RSI;
  long in_RDI;
  __type_conflict2 _Var10;
  EXIT_DATA *pexit;
  int door;
  bool found;
  bool fAuto;
  char buf [4608];
  CHAR_DATA *in_stack_ffffffffffffed48;
  CHAR_DATA *in_stack_ffffffffffffed58;
  ROOM_INDEX_DATA *in_stack_ffffffffffffed60;
  CHAR_DATA *in_stack_ffffffffffffed68;
  char *local_1280;
  int local_1220;
  CHAR_DATA local_1218 [5];
  char *local_10;
  long local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  bVar4 = check_blind(in_stack_ffffffffffffed58);
  if (bVar4) {
    bVar4 = is_affected_room(*(ROOM_INDEX_DATA **)(local_8 + 0xa8),(int)gsn_smokescreen);
    if (bVar4) {
      pcVar8 = get_char_color(in_stack_ffffffffffffed68,(char *)in_stack_ffffffffffffed60);
      pcVar9 = END_COLOR(in_stack_ffffffffffffed58);
      sprintf((char *)local_1218,"%sDense smoke prevents any vision beyond this room!%s\n\r",pcVar8,
              pcVar9);
      send_to_char((char *)in_stack_ffffffffffffed60,in_stack_ffffffffffffed58);
    }
    bVar4 = str_cmp(local_10,"auto");
    bVar5 = (bVar4 ^ 0xffU) & 1;
    if (bVar5 == 0) {
      bVar4 = is_immortal(in_stack_ffffffffffffed48);
      if (bVar4) {
        sprintf((char *)local_1218,"Obvious exits from room %d:\n\r",
                (ulong)(uint)(int)*(short *)(*(long *)(local_8 + 0xa8) + 0x13a));
      }
      else {
        sprintf((char *)local_1218,"Obvious exits:\n\r");
      }
    }
    else {
      sprintf((char *)local_1218,"[Exits:");
    }
    bVar4 = false;
    for (local_1220 = 0; local_1220 < 6; local_1220 = local_1220 + 1) {
      plVar1 = *(long **)(*(long *)(local_8 + 0xa8) + 0x38 + (long)local_1220 * 8);
      if (((((plVar1 != (long *)0x0) && (*plVar1 != 0)) &&
           (bVar6 = can_see_room(in_stack_ffffffffffffed68,in_stack_ffffffffffffed60), bVar6)) &&
          ((uVar2 = plVar1[1], _Var10 = std::pow<int,int>(0,0x549741), (uVar2 & (long)_Var10) == 0
           || (bVar6 = is_immortal(in_stack_ffffffffffffed48), bVar6)))) &&
         (bVar6 = is_affected_room(*(ROOM_INDEX_DATA **)(local_8 + 0xa8),(int)gsn_smokescreen),
         !bVar6)) {
        bVar4 = true;
        if (bVar5 == 0) {
          sVar7 = strlen((char *)local_1218);
          pcVar8 = capitalize(dir_name[local_1220]);
          bVar6 = room_is_dark((ROOM_INDEX_DATA *)in_stack_ffffffffffffed48);
          if (bVar6) {
            local_1280 = "Too dark to tell";
          }
          else {
            local_1280 = get_room_name((ROOM_INDEX_DATA *)in_stack_ffffffffffffed48);
          }
          sprintf((char *)((long)&local_1218[0].next + sVar7),"%-5s - %s",pcVar8,local_1280);
          bVar6 = is_immortal(in_stack_ffffffffffffed48);
          if (bVar6) {
            in_stack_ffffffffffffed58 = local_1218;
            sVar7 = strlen((char *)local_1218);
            ppCVar3 = &in_stack_ffffffffffffed58->next;
            in_stack_ffffffffffffed60 = (ROOM_INDEX_DATA *)plVar1[1];
            _Var10 = std::pow<int,int>(0,0x5499d0);
            pcVar8 = "";
            if (((ulong)in_stack_ffffffffffffed60 & (long)_Var10) != 0) {
              pcVar8 = "(CLOSED) ";
            }
            in_stack_ffffffffffffed68 = (CHAR_DATA *)plVar1[1];
            _Var10 = std::pow<int,int>(0,0x549a18);
            pcVar9 = "";
            if (((ulong)in_stack_ffffffffffffed68 & (long)_Var10) != 0) {
              pcVar9 = "(NONOBVIOUS) ";
            }
            sprintf((char *)((long)ppCVar3 + sVar7)," %s%s(room %d)\n\r",pcVar8,pcVar9,
                    (ulong)(uint)(int)*(short *)(*plVar1 + 0x13a));
          }
          else {
            sVar7 = strlen((char *)local_1218);
            sprintf((char *)((long)&local_1218[0].next + sVar7),"\n\r");
          }
        }
        else {
          strcat((char *)local_1218," ");
          uVar2 = plVar1[1];
          _Var10 = std::pow<int,int>(0,0x5497da);
          if (((uVar2 & (long)_Var10) != 0) ||
             (uVar2 = plVar1[1], _Var10 = std::pow<int,int>(0,0x54980d), (uVar2 & (long)_Var10) != 0
             )) {
            strcat((char *)local_1218,"(");
          }
          strcat((char *)local_1218,dir_name[local_1220]);
          uVar2 = plVar1[1];
          _Var10 = std::pow<int,int>(0,0x549874);
          if (((uVar2 & (long)_Var10) != 0) ||
             (uVar2 = plVar1[1], _Var10 = std::pow<int,int>(0,0x5498a7), (uVar2 & (long)_Var10) != 0
             )) {
            strcat((char *)local_1218,")");
          }
        }
      }
    }
    if (!bVar4) {
      pcVar8 = "None.\n\r";
      if (bVar5 != 0) {
        pcVar8 = " none";
      }
      strcat((char *)local_1218,pcVar8);
    }
    if (bVar5 != 0) {
      strcat((char *)local_1218,"]\n\r");
    }
    send_to_char((char *)in_stack_ffffffffffffed60,in_stack_ffffffffffffed58);
  }
  return;
}

Assistant:

void do_exits(CHAR_DATA *ch, char *argument)
{
	if (!check_blind(ch))
		return;

	char buf[MAX_STRING_LENGTH];
	if (is_affected_room(ch->in_room, gsn_smokescreen))
	{
		sprintf(buf, "%sDense smoke prevents any vision beyond this room!%s\n\r",
			get_char_color(ch, "darkgrey"),
			END_COLOR(ch));

		send_to_char(buf, ch);
	}

	auto fAuto = !str_cmp(argument, "auto");
	if (fAuto)
		sprintf(buf, "[Exits:");
	else if (is_immortal(ch))
		sprintf(buf, "Obvious exits from room %d:\n\r", ch->in_room->vnum);
	else
		sprintf(buf, "Obvious exits:\n\r");

	auto found = false;
	for (auto door = 0; door <= 5; door++)
	{
		auto pexit = ch->in_room->exit[door];

		if (pexit != nullptr
			&& pexit->u1.to_room != nullptr
			&& can_see_room(ch, pexit->u1.to_room)
			&& (!IS_SET(pexit->exit_info, EX_NONOBVIOUS) || is_immortal(ch))
			&& !is_affected_room(ch->in_room, gsn_smokescreen))
		{
			found = true;

			if (fAuto)
			{
				strcat(buf, " ");
				if (IS_SET(pexit->exit_info, EX_CLOSED) || IS_SET(pexit->exit_info, EX_NONOBVIOUS))
					strcat(buf, "(");

				strcat(buf, dir_name[door]);
				if (IS_SET(pexit->exit_info, EX_CLOSED) || IS_SET(pexit->exit_info, EX_NONOBVIOUS))
					strcat(buf, ")");
			}
			else
			{
				sprintf(buf + strlen(buf), "%-5s - %s",
					capitalize(dir_name[door]),
					room_is_dark(pexit->u1.to_room) ? "Too dark to tell" : get_room_name(pexit->u1.to_room));

				if (is_immortal(ch))
					sprintf(buf + strlen(buf), " %s%s(room %d)\n\r",
						IS_SET(pexit->exit_info, EX_CLOSED) ? "(CLOSED) " : "",
						IS_SET(pexit->exit_info, EX_NONOBVIOUS) ? "(NONOBVIOUS) " : "", pexit->u1.to_room->vnum);
				else
					sprintf(buf + strlen(buf), "\n\r");
			}
		}
	}

	if (!found)
		strcat(buf, fAuto ? " none" : "None.\n\r");

	if (fAuto)
		strcat(buf, "]\n\r");

	send_to_char(buf, ch);
}